

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall
CRegexParser::build_group
          (CRegexParser *this,re_machine *new_machine,re_machine *sub_machine,int group_id)

{
  init_machine(this,new_machine);
  set_trans(this,new_machine->init,sub_machine->init,RE_GROUP_ENTER,group_id);
  set_trans(this,sub_machine->final,new_machine->final,RE_GROUP_EXIT,group_id);
  return;
}

Assistant:

void CRegexParser::build_group(re_machine *new_machine,
                               re_machine *sub_machine, int group_id)
{
    /* initialize the container machine */
    init_machine(new_machine);

    /* 
     *   Set up a group-entry transition from the new machine's initial
     *   state into the initial state of the group, and a group-exit
     *   transition from the group's final state into the container's final
     *   state.  For both transitions, store the group ID in the character
     *   field of the transition, to identify which group is affected.  
     */
    set_trans(new_machine->init, sub_machine->init,
              RE_GROUP_ENTER, (wchar_t)group_id);
    set_trans(sub_machine->final, new_machine->final,
              RE_GROUP_EXIT, (wchar_t)group_id);
}